

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

void If_Dec7ComposeLut4(int t,word (*f) [2],word *r)

{
  uint uVar1;
  ulong uVar2;
  word *pwVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  *r = 0;
  r[1] = 0;
  uVar1 = 0;
  do {
    if (((uint)t >> (uVar1 & 0x1f) & 1) != 0) {
      uVar2 = 0xffffffffffffffff;
      lVar5 = 0;
      uVar4 = 0xffffffffffffffff;
      pwVar3 = *f + 1;
      do {
        uVar6 = (ulong)((uVar1 >> ((uint)lVar5 & 0x1f) & 1) != 0) - 1;
        uVar2 = uVar2 & ((*(word (*) [2])(pwVar3 + -1))[0] ^ uVar6);
        uVar4 = uVar4 & (uVar6 ^ *pwVar3);
        lVar5 = lVar5 + 1;
        pwVar3 = pwVar3 + 2;
      } while (lVar5 != 4);
      *r = *r | uVar2;
      r[1] = r[1] | uVar4;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x10);
  return;
}

Assistant:

static void If_Dec7ComposeLut4( int t, word f[4][2], word r[2] )
{
    int m, v;
    word c[2];
    r[0] = r[1] = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c[0] = c[1] = ~(word)0;
        for ( v = 0; v < 4; v++ )
        {
            c[0] &= ((m >> v) & 1) ? f[v][0] : ~f[v][0];
            c[1] &= ((m >> v) & 1) ? f[v][1] : ~f[v][1];
        }
        r[0] |= c[0];
        r[1] |= c[1];
    }
}